

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

bool __thiscall ServerService::startService(ServerService *this)

{
  byte *__s;
  _Alloc_hider data;
  bool bVar1;
  uint __fd;
  int socketFD;
  ServerSegment *pSVar2;
  size_t sVar3;
  long lVar4;
  sockaddr *psVar5;
  ServerService *this_00;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  byte bVar9;
  socklen_t clientLength;
  string key;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  sockaddr_storage in_stack_fffffffffffff8b8;
  socklen_t local_6bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  sockaddr local_678 [8];
  byte local_5f8 [1480];
  
  bVar9 = 0;
  memset(local_5f8,0,0x5c0);
  local_6bc = 0x80;
  bVar1 = false;
LAB_00102d5f:
  bVar7 = bVar1;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  this_00 = (ServerService *)(ulong)__fd;
  recvfrom(__fd,local_5f8,0x5c0,0,local_678,&local_6bc);
  pSVar2 = parseRequest(this_00,local_5f8);
  if ((pSVar2->data == (byte *)0x0) || (pSVar2->ackFlag != 'N')) goto LAB_00102ddf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Received: ",10);
  __s = pSVar2->data;
  if (__s == (byte *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109160);
  }
  else {
    sVar3 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__cxx11::string::string((string *)&local_6b8,(char *)pSVar2->data,(allocator *)&local_698);
  std::operator+(&local_698,"I received ",&local_6b8);
  std::__cxx11::string::operator=((string *)&local_6b8,(string *)&local_698);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  iVar8 = 200;
  do {
    std::__cxx11::string::append((char *)&local_6b8);
    data._M_p = local_6b8._M_dataplus._M_p;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  socketFD = ServerSocketUDP::getSocket(this->serverSocketUDP);
  iVar8 = this->receiverWindowSize;
  psVar5 = local_678;
  puVar6 = (undefined8 *)&stack0xfffffffffffff8b8;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *(undefined8 *)psVar5;
    psVar5 = (sockaddr *)(psVar5[-(ulong)bVar9].sa_data + 6);
    puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
  }
  sendSegments(this,(byte *)data._M_p,socketFD,in_stack_fffffffffffff8b8,iVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  goto LAB_00102f02;
LAB_00102ddf:
  bVar1 = false;
  if (bVar7) {
LAB_00102f02:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Sent all segments. Closing server connection.",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    bVar1 = true;
  }
  goto LAB_00102d5f;
}

Assistant:

bool ServerService::startService() {

    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    bool flag = false;
    clientLength = sizeof(clientDetails);
    while (true) {
        recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
        ServerSegment *segment = parseRequest(buffer);
        if (segment->data && segment->ackFlag == 'N') {
            cout << "Received: ";
            cout << (char *) segment->data << endl;
            string key = (char *) segment->data;
            key = "I received " + key;
            for (int i = 0; i < 200; ++i) {
                key += "123 hjg ghjfhdjg hj cjchjfghjcghjc   yjccgyjvghjvg jyy yjcgyj vyj";
            }
//            todo 对收到信息做处理，并响应请求
            if (sendSegments((byte *) key.c_str(), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize)) {
                flag = true;
            }
        }
        if (flag) {
            cout << "Sent all segments. Closing server connection." << endl;
//            break;
        }
    }
}